

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float64_to_float32_s390x(float64 a,float_status *s)

{
  float32 fVar1;
  FloatParts FVar2;
  
  FVar2 = float64_unpack_canonical(a,s);
  FVar2 = float_to_float(FVar2,&float32_params,s);
  fVar1 = float32_round_pack_canonical(FVar2,s);
  return fVar1;
}

Assistant:

float32 float64_to_float32(float64 a, float_status *s)
{
    FloatParts p = float64_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, &float32_params, s);
    return float32_round_pack_canonical(pr, s);
}